

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_CommandLineArguments_checkDefaultArguments_TestShell::createTest
          (TEST_CommandLineArguments_checkDefaultArguments_TestShell *this)

{
  TEST_CommandLineArguments_checkDefaultArguments_Test *this_00;
  
  this_00 = (TEST_CommandLineArguments_checkDefaultArguments_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                         ,0x22d);
  TEST_CommandLineArguments_checkDefaultArguments_Test::
  TEST_CommandLineArguments_checkDefaultArguments_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(CommandLineArguments, checkDefaultArguments)
{
    int argc = 1;
    const char* argv[] = { "tests.exe" };
    CHECK(newArgumentParser(argc, argv));
    CHECK(!args->isVerbose());
    LONGS_EQUAL(1, args->getRepeatCount());
    CHECK(NULLPTR == args->getGroupFilters());
    CHECK(NULLPTR == args->getNameFilters());
    CHECK(args->isEclipseOutput());
    CHECK(SimpleString("") == args->getPackageName());
    CHECK(!args->isCrashingOnFail());
    CHECK(args->isRethrowingExceptions());
}